

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolTable.h
# Opt level: O0

bool __thiscall
glslang::TSymbolTableLevel::findFunctionVariableName
          (TSymbolTableLevel *this,TString *name,bool *variable)

{
  bool bVar1;
  int iVar2;
  reference this_00;
  size_type __n;
  size_type parenAt;
  TString *candidateName;
  _Self local_30;
  const_iterator candidate;
  bool *variable_local;
  TString *name_local;
  TSymbolTableLevel *this_local;
  
  candidate._M_node = (_Base_ptr)variable;
  local_30._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TSymbol_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_glslang::pool_allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TSymbol_*>_>_>
       ::lower_bound(&this->level,name);
  candidateName =
       (TString *)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TSymbol_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_glslang::pool_allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TSymbol_*>_>_>
       ::end(&this->level);
  bVar1 = std::operator!=(&local_30,(_Self *)&candidateName);
  if (bVar1) {
    this_00 = std::
              _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TSymbol_*>_>
              ::operator*(&local_30);
    __n = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
          find_first_of(&this_00->first,'(',0);
    if (__n == 0xffffffffffffffff) {
      bVar1 = std::operator==(&this_00->first,name);
      if (bVar1) {
        *(undefined1 *)&(candidate._M_node)->_M_color = _S_black;
        return true;
      }
    }
    else {
      iVar2 = std::__cxx11::
              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::compare
                        (&this_00->first,0,__n,name);
      if (iVar2 == 0) {
        *(undefined1 *)&(candidate._M_node)->_M_color = _S_red;
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool findFunctionVariableName(const TString& name, bool& variable) const
    {
        tLevel::const_iterator candidate = level.lower_bound(name);
        if (candidate != level.end()) {
            const TString& candidateName = (*candidate).first;
            TString::size_type parenAt = candidateName.find_first_of('(');
            if (parenAt == candidateName.npos) {
                // not a mangled name
                if (candidateName == name) {
                    // found a variable name match
                    variable = true;
                    return true;
                }
            } else {
                // a mangled name
                if (candidateName.compare(0, parenAt, name) == 0) {
                    // found a function name match
                    variable = false;
                    return true;
                }
            }
        }

        return false;
    }